

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_privkey_negate(secp256k1_context *ctx,uchar *seckey)

{
  uchar *in_RSI;
  secp256k1_scalar sec;
  char *in_stack_ffffffffffffffc8;
  secp256k1_callback *in_stack_ffffffffffffffd0;
  secp256k1_scalar *in_stack_ffffffffffffffd8;
  secp256k1_scalar *in_stack_ffffffffffffffe0;
  uint local_4;
  
  if (in_RSI != (uchar *)0x0) {
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffffe0,(uchar *)in_stack_ffffffffffffffd8,
               (int *)in_stack_ffffffffffffffd0);
    secp256k1_scalar_negate(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    secp256k1_scalar_get_b32(in_RSI,(secp256k1_scalar *)&stack0xffffffffffffffc8);
  }
  else {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  local_4 = (uint)(in_RSI != (uchar *)0x0);
  return local_4;
}

Assistant:

int secp256k1_ec_privkey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, NULL);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    return 1;
}